

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::EvaluateSectionForceTorque
          (ChElementBeamTaperedTimoshenko *this,double eta,ChVector<double> *Fforce,
          ChVector<double> *Mtorque)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  byte bVar4;
  ChVector<double> *this_00;
  Scalar *pSVar5;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *pCVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  ChVectorDynamic<> displ_ec;
  ChVectorDynamic<> displ;
  ChVectorN<double,_6> sect_ek;
  ChVectorN<double,_4> qez;
  ChMatrixDynamic<> Teta;
  __tuple_element_t<4UL,_tuple<Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_2,_1,_1,_2>_>_>
  dkNx1;
  ChVectorN<double,_2> qerx;
  ChMatrixNM<double,_6,_6> Klaw_d;
  ChVectorN<double,_6> wrench;
  __tuple_element_t<1UL,_tuple<Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>_>_>
  dddkNbz;
  __tuple_element_t<0UL,_tuple<Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>_>_>
  dddkNby;
  __tuple_element_t<1UL,_tuple<Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>_>_>
  ddkNbz;
  __tuple_element_t<0UL,_tuple<Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>_>_>
  ddkNby;
  __tuple_element_t<3UL,_tuple<Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_2,_1,_1,_2>_>_>
  dkNsz;
  __tuple_element_t<1UL,_tuple<Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_2,_1,_1,_2>_>_>
  dkNsy;
  ChVectorN<double,_4> qey;
  ChVectorN<double,_2> qeux;
  ShapeFunctionGroup NN;
  ChMatrixNM<double,_6,_6> Klaw_r;
  void *local_970 [2];
  double local_960;
  double local_958;
  Matrix<double,_4,_1,_0,_4,_1> *local_950;
  ChVector<double> *local_948;
  Matrix<double,__1,_1,_0,__1,_1> local_940;
  long local_930;
  undefined8 uStack_928;
  double local_920;
  undefined8 uStack_918;
  undefined1 local_910 [80];
  double local_8c0;
  double dStack_8b8;
  double local_8b0;
  double dStack_8a8;
  ChMatrixDynamic<> local_8a0;
  undefined1 local_880 [40];
  VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> local_858;
  Matrix<double,_4,_1,_0,_4,_1> *local_820;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_818;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_810;
  long local_7e8;
  long local_7b0;
  double local_778;
  double local_740;
  double local_708;
  Matrix<double,_6,_1,_0,_6,_1> local_6f0;
  Matrix<double,_4,_1,_0,_4,_1> local_6c0;
  Matrix<double,_4,_1,_0,_4,_1> local_6a0;
  Matrix<double,_4,_1,_0,_4,_1> local_680;
  Matrix<double,_4,_1,_0,_4,_1> local_660;
  Matrix<double,_4,_1,_0,_4,_1> local_640;
  Matrix<double,_4,_1,_0,_4,_1> local_620;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_600 [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_5d0;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_5c0;
  double dStack_5b0;
  double dStack_5a8;
  double local_5a0;
  double dStack_598;
  double dStack_590;
  double dStack_588;
  double local_580;
  double dStack_578;
  double dStack_570;
  double dStack_568;
  double local_560;
  double dStack_558;
  double dStack_550;
  double dStack_548;
  double local_540;
  double dStack_538;
  double local_520;
  double dStack_518;
  double dStack_510;
  double dStack_508;
  double local_4e0;
  double dStack_4d8;
  double dStack_4d0;
  double dStack_4c8;
  DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> local_1a0 [368];
  
  local_960 = eta;
  if ((this->tapered_section).
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    local_5c0.m_lhs._0_4_ =
         (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
           _vptr_ChElementBase[3])();
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_940,(int *)&local_5c0);
    (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
              (this,&local_940);
    local_5c0 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->T,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_940);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_970,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_5c0);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_970,1);
    local_5c0.m_rhs = (RhsNested)0x0;
    local_5c0.m_lhs = (LhsNested)local_600;
    dStack_5b0 = 4.94065645841247e-324;
    dStack_5a8 = 4.94065645841247e-324;
    local_600[0]._vptr__Sp_counted_base = (_func_int **)*pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_970,5);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_5c0,pSVar5
                       );
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_970,7);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                       (pCVar6,pSVar5);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_970,0xb)
    ;
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar6,pSVar5);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_5c0);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_970,2);
    local_5c0.m_rhs = (RhsNested)0x0;
    local_5c0.m_lhs = (LhsNested)(local_910 + 0x30);
    dStack_5b0 = 4.94065645841247e-324;
    dStack_5a8 = 4.94065645841247e-324;
    local_910._48_8_ = *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_970,4);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_5c0,pSVar5
                       );
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_970,8);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                       (pCVar6,pSVar5);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_970,10);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar6,pSVar5);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_5c0);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_970,0);
    local_5c0.m_rhs = (RhsNested)0x0;
    local_5c0.m_lhs = (LhsNested)&local_5d0;
    dStack_5b0 = 4.94065645841247e-324;
    dStack_5a8 = 4.94065645841247e-324;
    local_5d0._vptr__Sp_counted_base = (_func_int **)*pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_970,6);
    Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_5c0,pSVar5);
    local_948 = Fforce;
    Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_5c0);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_970,3);
    local_5c0.m_rhs = (RhsNested)0x0;
    local_5c0.m_lhs = (LhsNested)(local_880 + 0x10);
    dStack_5b0 = 4.94065645841247e-324;
    dStack_5a8 = 4.94065645841247e-324;
    local_880._16_8_ = *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_970,9);
    Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_5c0,pSVar5);
    Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_5c0);
    ShapeFunctionsTimoshenko(this,(ShapeFunctionGroup *)&local_5c0,local_960);
    local_640.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = local_520;
    local_640.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = dStack_518;
    local_640.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = dStack_510;
    local_640.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = dStack_508;
    local_620.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = local_4e0;
    local_620.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = dStack_4d8;
    local_620.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = dStack_4d0;
    local_620.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = dStack_4c8;
    local_880._0_8_ = local_540;
    local_880._8_8_ = dStack_538;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = local_580;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = dStack_578;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = dStack_570;
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = dStack_568;
    local_660.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = local_560;
    local_660.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = dStack_558;
    local_660.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = dStack_550;
    local_660.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = dStack_548;
    local_6a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = local_5a0;
    local_6a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = dStack_598;
    local_6a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = dStack_590;
    local_6a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = dStack_588;
    local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = (double)local_5c0.m_lhs;
    local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1]
         = (double)local_5c0.m_rhs;
    local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
         = dStack_5b0;
    local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
         = dStack_5a8;
    (*((this->tapered_section).
       super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(&local_820);
    local_950 = (Matrix<double,_4,_1,_0,_4,_1> *)
                local_820[5].super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[1];
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_818);
    (*((this->tapered_section).
       super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(&local_820);
    local_958 = local_820[5].super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[2];
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_818);
    (*((this->tapered_section).
       super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(&local_820);
    local_920 = local_820[5].super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[3];
    uStack_918 = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_818);
    (*((this->tapered_section).
       super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(&local_820);
    local_930 = (long)local_820[6].super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                      m_storage.m_data.array[0];
    uStack_928 = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_818);
    (*((this->tapered_section).
       super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(&local_820);
    local_8b0 = local_820[6].super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[1];
    dStack_8a8 = 0.0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_818);
    (*((this->tapered_section).
       super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(&local_820);
    local_8c0 = local_820[6].super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[2];
    dStack_8b8 = 0.0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_818);
    local_820 = (Matrix<double,_4,_1,_0,_4,_1> *)local_880;
    local_818._M_pi = &local_5d0;
    local_910._0_8_ =
         Eigen::internal::dense_product_base::operator_cast_to_double
                   ((dense_product_base *)&local_820);
    local_818._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_880 + 0x10);
    local_820 = (Matrix<double,_4,_1,_0,_4,_1> *)local_880;
    local_910._24_8_ =
         Eigen::internal::dense_product_base::operator_cast_to_double
                   ((dense_product_base *)&local_820);
    local_820 = &local_680;
    local_810 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_910 + 0x30);
    local_910._32_8_ =
         Eigen::internal::dense_product_base::operator_cast_to_double
                   ((dense_product_base *)&local_820);
    local_820 = &local_660;
    local_818._M_pi = local_600;
    local_910._40_8_ =
         Eigen::internal::dense_product_base::operator_cast_to_double
                   ((dense_product_base *)&local_820);
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    auVar1._8_8_ = uStack_918;
    auVar1._0_8_ = local_920;
    auVar1 = vandpd_avx(auVar8,auVar1);
    auVar2._8_8_ = uStack_928;
    auVar2._0_8_ = local_930;
    auVar2 = vandpd_avx(auVar8,auVar2);
    uVar3 = vcmppd_avx512vl(auVar1,ZEXT816(0x3f50624dd2f1a9fc),5);
    uVar7 = vcmppd_avx512vl(auVar2,ZEXT816(0x3f50624dd2f1a9fc),5);
    uVar7 = ((byte)uVar3 & 3) & uVar7;
    if ((uVar7 & 1) == 0) {
      local_820 = &local_6a0;
      local_810 = local_600;
      local_910._8_8_ =
           Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_820);
      local_820 = &local_6c0;
      local_810 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_910 + 0x30);
      local_910._16_8_ =
           Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_820);
    }
    else {
      local_820 = &local_620;
      local_818._M_pi = local_600;
      local_910._8_8_ =
           Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_820);
      local_820 = &local_640;
      local_818._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_910 + 0x30);
      local_910._16_8_ =
           Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_820);
    }
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&local_820);
    local_8a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
    local_820 = local_950;
    local_778 = local_958;
    local_740 = local_8b0;
    local_708 = local_8c0;
    bVar4 = (byte)uVar7;
    local_7e8 = (ulong)(bVar4 & 1) * (long)local_920 + (ulong)!(bool)(bVar4 & 1) * (long)local_8c0;
    local_7b0 = (ulong)(bVar4 & 1) * local_930 + (ulong)!(bool)(bVar4 & 1) * (long)local_8b0;
    local_8a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    local_8a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
    ComputeTransformMatrixAtPoint(this,&local_8a0,local_960);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero(local_1a0);
    this_00 = local_948;
    local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
         = (double)&local_8a0;
    local_858.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>._0_16_ =
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)&local_6f0,
                    (MatrixBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&local_820);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Matrix<double,6,6,1,6,6>,0>>
              ((Matrix<double,_6,_6,_1,_6,_6> *)local_1a0,
               (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
                *)&local_858);
    local_858.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>.m_rows.
    m_value = (long)local_910;
    local_858.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>.m_data =
         (PointerType)local_1a0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&local_6f0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&local_858);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              (&local_858,&local_6f0,0,3);
    ChVector<double>::operator=
              (this_00,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)&local_858);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              (&local_858,&local_6f0,3,3);
    ChVector<double>::operator=
              (Mtorque,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)&local_858);
    Eigen::internal::handmade_aligned_free
              (local_8a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free(local_970[0]);
    Eigen::internal::handmade_aligned_free
              (local_940.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    return;
  }
  __assert_fail("tapered_section",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                ,0x50a,
                "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::EvaluateSectionForceTorque(const double, ChVector<> &, ChVector<> &)"
               );
}

Assistant:

void ChElementBeamTaperedTimoshenko::EvaluateSectionForceTorque(const double eta,
                                                                ChVector<>& Fforce,
                                                                ChVector<>& Mtorque) {
    assert(tapered_section);

    ChVectorDynamic<> displ(this->GetNdofs());
    this->GetStateBlock(displ);

    ChVectorDynamic<> displ_ec = this->T * displ;  // transform the displacement of two nodes to elastic axis

    ChVectorN<double, 4> qey;
    qey << displ_ec(1), displ_ec(5), displ_ec(7), displ_ec(11);
    ChVectorN<double, 4> qez;
    qez << displ_ec(2), displ_ec(4), displ_ec(8), displ_ec(10);
    ChVectorN<double, 2> qeux;
    qeux << displ_ec(0), displ_ec(6);
    ChVectorN<double, 2> qerx;
    qerx << displ_ec(3), displ_ec(9);

    ShapeFunctionGroup NN;
    ShapeFunctionsTimoshenko(NN, eta);
    ShapeFunction5Blocks sfblk1d = std::get<2>(NN);
    ShapeFunction2Blocks sfblk2d = std::get<3>(NN);
    ShapeFunction2Blocks sfblk3d = std::get<4>(NN);
    auto dkNx1 = std::get<4>(sfblk1d);
    auto dkNsy = std::get<1>(sfblk1d);
    auto dkNsz = std::get<3>(sfblk1d);
    auto ddkNby = std::get<0>(sfblk2d);
    auto ddkNbz = std::get<1>(sfblk2d);
    auto dddkNby = std::get<0>(sfblk3d);
    auto dddkNbz = std::get<1>(sfblk3d);

    double EA = this->tapered_section->GetAverageSectionParameters()->EA;
    double GJ = this->tapered_section->GetAverageSectionParameters()->GJ;
    double GAyy = this->tapered_section->GetAverageSectionParameters()->GAyy;
    double GAzz = this->tapered_section->GetAverageSectionParameters()->GAzz;
    double EIyy = this->tapered_section->GetAverageSectionParameters()->EIyy;
    double EIzz = this->tapered_section->GetAverageSectionParameters()->EIzz;

    double eps = 1.0e-3;
    bool use_shear_stain = true;  // As default, use shear strain to evaluate the shear forces
    if (abs(GAyy) < eps ||
        abs(GAzz) < eps) {  // Sometimes, the user will not input GAyy, GAzz, so GAyy, GAzz may be zero.
        use_shear_stain = false;
    }

    // generalized strains/curvatures;
    ChVectorN<double, 6> sect_ek;
    sect_ek(0) = dkNx1 * qeux;   // ux
    sect_ek(3) = dkNx1 * qerx;   // rotx
    sect_ek(4) = -ddkNbz * qez;  // roty
    sect_ek(5) = ddkNby * qey;   // rotz

    if (use_shear_stain) {
        // Strictly speaking, dkNsy * qey,dkNsz * qez are the real shear strains.
        sect_ek(1) = dkNsy * qey;  // gamma_y = dkNsy * qey; Fy = GAyy * gamma_y;
        sect_ek(2) = dkNsz * qez;  // gamma_z = dkNsz * qez; Fz = GAzz * gamma_z;
    } else {
        // Calculate the shear strain through third-differentian of bending displacement
        sect_ek(1) = -dddkNby * qey;  // Fy == -EIzz * dddkNby * qey == GAyy * dkNsy * qey;
        sect_ek(2) = -dddkNbz * qez;  // Fz == -EIyy *  dddkNbz * qez == GAzz * dkNsz * qez;
    }

    if (false)  // section->alpha ==0 && section->Cy ==0 && section->Cz==0 && section->Sy==0 && section->Sz==0)
    {
        // Fast computation:
        Fforce.x() = EA * sect_ek(0);
        if (use_shear_stain) {
            Fforce.y() = GAyy * sect_ek(1);
            Fforce.z() = GAzz * sect_ek(2);
        } else {
            Fforce.y() = EIzz * sect_ek(1);
            Fforce.z() = EIyy * sect_ek(2);
        }

        Mtorque.x() = GJ * sect_ek(3);
        Mtorque.y() = EIyy * sect_ek(4);
        Mtorque.z() = EIzz * sect_ek(5);
    } else {
        // Constitutive matrix of the beam:
        ChMatrixNM<double, 6, 6> Klaw_d;
        Klaw_d.setZero();
        Klaw_d(0, 0) = EA;
        Klaw_d(3, 3) = GJ;
        Klaw_d(4, 4) = EIyy;
        Klaw_d(5, 5) = EIzz;

        if (use_shear_stain) {
            Klaw_d(1, 1) = GAyy;
            Klaw_d(2, 2) = GAzz;
        } else {
            Klaw_d(1, 1) = EIzz;
            Klaw_d(2, 2) = EIyy;
        }

        ChMatrixDynamic<> Teta;
        ComputeTransformMatrixAtPoint(Teta, eta);

        // ..unrolled rotated constitutive matrix..
        ChMatrixNM<double, 6, 6> Klaw_r;
        Klaw_r.setZero();
        Klaw_r = Teta.transpose() * Klaw_d;

        // .. compute wrench = Klaw_r * sect_ek
        ChVectorN<double, 6> wrench = Klaw_r * sect_ek;
        Fforce = wrench.segment(0, 3);
        Mtorque = wrench.segment(3, 3);
    }
}